

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCo.c
# Opt level: O2

void Gia_PolynCoreCollect_rec(Gia_Man_t *pGia,int iObj,Vec_Int_t *vNodes,Vec_Bit_t *vVisited)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  Gia_Obj_t *pGVar5;
  byte bVar6;
  uint uVar7;
  long lVar8;
  size_t __size;
  long lVar9;
  
  iVar2 = Vec_BitEntry(vVisited,iObj);
  if (iVar2 != 0) {
    return;
  }
  uVar3 = vVisited->nSize;
  if ((int)uVar3 <= iObj) {
    uVar1 = iObj + 1;
    iVar2 = vVisited->nCap;
    uVar7 = uVar1;
    if (((iVar2 * 2 <= iObj) || (uVar7 = iVar2 * 2, iVar2 <= iObj)) && (iVar2 < (int)uVar7)) {
      iVar2 = (((int)uVar7 >> 5) + 1) - (uint)((uVar7 & 0x1f) == 0);
      __size = (long)iVar2 << 2;
      if (vVisited->pArray == (int *)0x0) {
        piVar4 = (int *)malloc(__size);
      }
      else {
        piVar4 = (int *)realloc(vVisited->pArray,__size);
      }
      vVisited->pArray = piVar4;
      if (piVar4 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x163,"void Vec_BitGrow(Vec_Bit_t *, int)");
      }
      vVisited->nCap = iVar2 * 0x20;
      uVar3 = vVisited->nSize;
    }
    if (iObj < (int)uVar3) {
      __assert_fail("p->nSize < nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                    ,0x19a,"void Vec_BitFillExtra(Vec_Bit_t *, int, int)");
    }
    iVar2 = (int)uVar3 >> 5;
    bVar6 = (byte)uVar1;
    if (iVar2 == (int)uVar1 >> 5) {
      vVisited->pArray[iVar2] =
           vVisited->pArray[iVar2] &
           ~(~(-1 << (bVar6 - (byte)uVar3 & 0x1f)) << ((byte)uVar3 & 0x1f));
    }
    else {
      piVar4 = vVisited->pArray;
      lVar8 = (long)iVar2;
      piVar4[lVar8] =
           piVar4[lVar8] & (-(uint)((uVar3 & 0x1f) == 0) | ~(-1 << (sbyte)(uVar3 & 0x1f)));
      lVar9 = (long)((int)uVar1 >> 5);
      piVar4[lVar9] = ((uint)piVar4[lVar9] >> (bVar6 & 0x1f)) << (bVar6 & 0x1f);
      while (lVar8 = lVar8 + 1, lVar8 < lVar9) {
        piVar4[lVar8] = 0;
      }
    }
    vVisited->nSize = uVar1;
  }
  Vec_BitWriteEntry(vVisited,iObj,1);
  pGVar5 = Gia_ManObj(pGia,iObj);
  iVar2 = Gia_ObjFaninId0p(pGia,pGVar5);
  Gia_PolynCoreCollect_rec(pGia,iVar2,vNodes,vVisited);
  pGVar5 = Gia_ManObj(pGia,iObj);
  iVar2 = Gia_ObjId(pGia,pGVar5);
  Gia_PolynCoreCollect_rec(pGia,iVar2 - (*(uint *)&pGVar5->field_0x4 & 0x1fffffff),vNodes,vVisited);
  Vec_IntPush(vNodes,iObj);
  return;
}

Assistant:

void Gia_PolynCoreCollect_rec( Gia_Man_t * pGia, int iObj, Vec_Int_t * vNodes, Vec_Bit_t * vVisited )
{
    if ( Vec_BitEntry(vVisited, iObj) )
        return;
    Vec_BitSetEntry( vVisited, iObj, 1 );
    Gia_PolynCoreCollect_rec( pGia, Gia_ObjFaninId0p(pGia, Gia_ManObj(pGia, iObj)), vNodes, vVisited );
    Gia_PolynCoreCollect_rec( pGia, Gia_ObjFaninId1p(pGia, Gia_ManObj(pGia, iObj)), vNodes, vVisited );
    Vec_IntPush( vNodes, iObj );
}